

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

void __thiscall
Encoder::SaveToLazyBailOutRecordList(Encoder *this,Instr *instr,uint32 currentOffset)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar3;
  undefined1 local_38 [8];
  LazyBailOutRecord record;
  BailOutInfo *bailOutInfo;
  uint32 currentOffset_local;
  Instr *instr_local;
  Encoder *this_local;
  
  record.bailOutRecord = (BailOutRecord *)IR::Instr::GetBailOutInfo(instr);
  bVar2 = IR::Instr::OnlyHasLazyBailOut(instr);
  if ((!bVar2) || ((record.bailOutRecord)->parent == (BailOutRecord *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x67d,
                       "(instr->OnlyHasLazyBailOut() && bailOutInfo->bailOutRecord != nullptr)",
                       "instr->OnlyHasLazyBailOut() && bailOutInfo->bailOutRecord != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ea1258,LazyBailoutPhase,sourceContextId,functionId)
  ;
  if (bVar2) {
    Output::Print(L"Offset: %u Instr: ",(ulong)currentOffset);
    IR::Instr::Dump(instr);
    Output::Print(L"Bailout label: ");
    IR::Instr::Dump(*(Instr **)&record.bailOutRecord[1].localOffsetsCount);
  }
  LazyBailOutRecord::LazyBailOutRecord
            ((LazyBailOutRecord *)local_38,currentOffset,(record.bailOutRecord)->parent);
  JsUtil::
  List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (this->m_sortedLazyBailoutRecordList,(LazyBailOutRecord *)local_38);
  return;
}

Assistant:

void
Encoder::SaveToLazyBailOutRecordList(IR::Instr* instr, uint32 currentOffset)
{
    BailOutInfo* bailOutInfo = instr->GetBailOutInfo();

    Assert(instr->OnlyHasLazyBailOut() && bailOutInfo->bailOutRecord != nullptr);

#if DBG_DUMP
    if (PHASE_DUMP(Js::LazyBailoutPhase, m_func))
    {
        Output::Print(_u("Offset: %u Instr: "), currentOffset);
        instr->Dump();
        Output::Print(_u("Bailout label: "));
        bailOutInfo->bailOutInstr->Dump();
    }
#endif

    LazyBailOutRecord record(currentOffset, bailOutInfo->bailOutRecord);
    this->m_sortedLazyBailoutRecordList->Add(record);
}